

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O1

D_Scope * commit_D_Scope(D_Scope *st)

{
  D_Scope **ppDVar1;
  D_Sym **ppDVar2;
  ulong uVar3;
  ulong uVar4;
  D_Scope *pDVar5;
  D_Sym *pDVar6;
  D_Sym *pDVar7;
  D_Sym *pDVar8;
  D_Scope *pDVar9;
  
  pDVar9 = st;
  pDVar5 = st;
  if (st->up == (D_Scope *)0x0) {
    do {
      pDVar5 = pDVar9;
      pDVar9 = pDVar5->search;
    } while (pDVar5->search != (D_Scope *)0x0);
    commit_ll(st,pDVar5->hash);
    uVar3 = (ulong)(pDVar5->hash->syms).n;
    if (uVar3 != 0) {
      ppDVar2 = (pDVar5->hash->syms).v;
      uVar4 = 0;
      do {
        for (pDVar6 = ppDVar2[uVar4]; pDVar6 != (D_Sym *)0x0; pDVar6 = pDVar6->next) {
          pDVar7 = pDVar6->update_of;
          if (pDVar6->update_of == (D_Sym *)0x0) {
            pDVar7 = pDVar6;
          }
          pDVar8 = pDVar7;
          pDVar9 = st;
          if (st != (D_Scope *)0x0) {
            do {
              for (pDVar8 = pDVar9->updates; pDVar8 != (D_Sym *)0x0; pDVar8 = pDVar8->next) {
                if (pDVar8->update_of == pDVar7) goto LAB_001496f2;
              }
              ppDVar1 = &pDVar9->up_updates;
              pDVar8 = pDVar7;
              pDVar9 = *ppDVar1;
            } while (*ppDVar1 != (D_Scope *)0x0);
          }
LAB_001496f2:
          pDVar6->update_of = pDVar8;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != uVar3);
    }
  }
  return pDVar5;
}

Assistant:

D_Scope *commit_D_Scope(D_Scope *st) {
  D_Scope *x = st;
  if (st->up) return st;
  while (x->search) x = x->search;
  commit_ll(st, x->hash);
  commit_update(st, x->hash);
  return x;
}